

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Aig_Man_t * Aig_ManChoiceConstructive(Vec_Ptr_t *vAigs,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *vPios_00;
  void *pvVar6;
  Tim_Man_t *pTVar7;
  int local_44;
  int i;
  Aig_Man_t *pTemp;
  Aig_Man_t *pPrev;
  Aig_Man_t *pThis;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vPios;
  int fVerbose_local;
  Vec_Ptr_t *vAigs_local;
  
  pTemp = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
  pAVar3 = Aig_ManDupOrdered(pTemp);
  if (pAVar3->pReprs != (Aig_Obj_t **)0x0) {
    __assert_fail("pNew->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x625,"Aig_Man_t *Aig_ManChoiceConstructive(Vec_Ptr_t *, int)");
  }
  iVar1 = Vec_PtrSize(vAigs);
  iVar2 = Aig_ManObjNumMax(pAVar3);
  pAVar3->nReprsAlloc = iVar1 * iVar2;
  ppAVar4 = (Aig_Obj_t **)malloc((long)pAVar3->nReprsAlloc << 3);
  pAVar3->pReprs = ppAVar4;
  memset(pAVar3->pReprs,0,(long)pAVar3->nReprsAlloc << 3);
  for (local_44 = 1; iVar1 = Vec_PtrSize(vAigs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar5 = (Aig_Man_t *)Vec_PtrEntry(vAigs,local_44);
    Aig_ManChoiceConstructiveOne(pAVar3,pTemp,pAVar5);
    pTemp = pAVar5;
  }
  pAVar3 = Aig_ManRehash(pAVar3);
  Aig_ManMarkValidChoices(pAVar3);
  pAVar5 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
  vPios_00 = Aig_ManOrderPios(pAVar3,pAVar5);
  pAVar5 = Aig_ManDupDfsGuided(pAVar3,vPios_00);
  Aig_ManStop(pAVar3);
  Vec_PtrFree(vPios_00);
  pvVar6 = Vec_PtrEntry(vAigs,0);
  if (*(long *)((long)pvVar6 + 0x160) != 0) {
    pTVar7 = Tim_ManDup(*(Tim_Man_t **)((long)pvVar6 + 0x160),0);
    pAVar5->pManTime = pTVar7;
  }
  Aig_ManChoiceLevel(pAVar5);
  return pAVar5;
}

Assistant:

Aig_Man_t * Aig_ManChoiceConstructive( Vec_Ptr_t * vAigs, int fVerbose )
{
    Vec_Ptr_t * vPios;
    Aig_Man_t * pNew, * pThis, * pPrev, * pTemp;
    int i;
    // start AIG with choices
    pPrev = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    pNew = Aig_ManDupOrdered( pPrev );
    // create room for equivalent nodes and representatives
    assert( pNew->pReprs == NULL );
    pNew->nReprsAlloc = Vec_PtrSize(vAigs) * Aig_ManObjNumMax(pNew);
    pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, pNew->nReprsAlloc );
    memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * pNew->nReprsAlloc );
    // add other AIGs one by one
    Vec_PtrForEachEntryStart( Aig_Man_t *, vAigs, pThis, i, 1 )
    {
        Aig_ManChoiceConstructiveOne( pNew, pPrev, pThis );
        pPrev = pThis;
    }
    // derive the result of choicing
    pNew = Aig_ManRehash( pNew );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pNew );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pNew, (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 ) );
    pNew = Aig_ManDupDfsGuided( pTemp = pNew, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pNew );
    return pNew;
}